

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MhsReader.cpp
# Opt level: O2

void __thiscall adios2::core::engine::MhsReader::~MhsReader(MhsReader *this)

{
  ADIOS *this_00;
  int __val;
  string local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  (this->super_Engine)._vptr_Engine = (_func_int **)&PTR__MhsReader_008260f0;
  for (__val = 1; __val < this->m_Tiers; __val = __val + 1) {
    this_00 = ((this->super_Engine).m_IO)->m_ADIOS;
    std::__cxx11::to_string(&local_70,__val);
    std::operator+(&local_50,"SubIO",&local_70);
    ADIOS::RemoveIO(this_00,&local_50);
    std::__cxx11::string::~string((string *)&local_50);
    std::__cxx11::string::~string((string *)&local_70);
  }
  (this->super_Engine).m_IsOpen = false;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&(this->m_SiriusCompressor).
              super___shared_ptr<adios2::core::compress::CompressSirius,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount);
  std::_Vector_base<adios2::core::Engine_*,_std::allocator<adios2::core::Engine_*>_>::~_Vector_base
            (&(this->m_SubEngines).
              super__Vector_base<adios2::core::Engine_*,_std::allocator<adios2::core::Engine_*>_>);
  std::_Vector_base<adios2::core::IO_*,_std::allocator<adios2::core::IO_*>_>::~_Vector_base
            (&(this->m_SubIOs).
              super__Vector_base<adios2::core::IO_*,_std::allocator<adios2::core::IO_*>_>);
  Engine::~Engine(&this->super_Engine);
  return;
}

Assistant:

MhsReader::~MhsReader()
{
    for (int i = 1; i < m_Tiers; ++i)
    {
        m_IO.m_ADIOS.RemoveIO("SubIO" + std::to_string(i));
    }
    if (m_IsOpen)
    {
        DestructorClose(m_FailVerbose);
    }
    m_IsOpen = false;
}